

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  Chunk CVar1;
  Chunk *pCVar2;
  int iVar3;
  long in_RSI;
  Bignum *in_RDI;
  int i_1;
  int i;
  int zero_bigits;
  int local_1c;
  int local_18;
  
  if (*(short *)(in_RSI + 2) < in_RDI->exponent_) {
    iVar3 = (int)in_RDI->exponent_ - (int)*(short *)(in_RSI + 2);
    EnsureCapacity(0);
    local_18 = (int)in_RDI->used_bigits_;
    while (local_18 = local_18 + -1, -1 < local_18) {
      pCVar2 = RawBigit(in_RDI,local_18);
      CVar1 = *pCVar2;
      pCVar2 = RawBigit(in_RDI,local_18 + iVar3);
      *pCVar2 = CVar1;
    }
    for (local_1c = 0; local_1c < iVar3; local_1c = local_1c + 1) {
      pCVar2 = RawBigit(in_RDI,local_1c);
      *pCVar2 = 0;
    }
    in_RDI->used_bigits_ = in_RDI->used_bigits_ + (short)iVar3;
    in_RDI->exponent_ = in_RDI->exponent_ - (short)iVar3;
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" bigit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    const int zero_bigits = exponent_ - other.exponent_;
    EnsureCapacity(used_bigits_ + zero_bigits);
    for (int i = used_bigits_ - 1; i >= 0; --i) {
      RawBigit(i + zero_bigits) = RawBigit(i);
    }
    for (int i = 0; i < zero_bigits; ++i) {
      RawBigit(i) = 0;
    }
    used_bigits_ += static_cast<int16_t>(zero_bigits);
    exponent_ -= static_cast<int16_t>(zero_bigits);

    DOUBLE_CONVERSION_ASSERT(used_bigits_ >= 0);
    DOUBLE_CONVERSION_ASSERT(exponent_ >= 0);
  }
}